

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O1

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::ThreadData::put_one(ThreadData *this)

{
  int64_t iVar1;
  anon_class_16_2_42c33408 put_func;
  unsigned_long type_index;
  param_type local_48;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  result_type local_18;
  
  local_48._M_b =
       (*(long *)(*(long *)(this + 8) + 0x48) - *(long *)(*(long *)(this + 8) + 0x40) >> 3) - 1;
  local_48._M_a = 0;
  local_18 = std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)&local_48,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)(this + 0x50),&local_48);
  local_48._M_b = (unsigned_long)&local_18;
  local_48._M_a = (unsigned_long)this;
  if (((byte)this[0x10] & 2) == 0) {
    put_one::anon_class_16_2_42c33408::operator()((anon_class_16_2_42c33408 *)&local_48);
  }
  else {
    pcStack_20 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h:513:33)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h:513:33)>
               ::_M_manager;
    local_38._M_unused._0_8_ = (undefined8)this;
    local_38._8_8_ = local_48._M_b;
    iVar1 = run_exception_test((function<void_()> *)&local_38);
    *(long *)(this + 0x38) = *(long *)(this + 0x38) + iVar1;
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  return;
}

Assistant:

void put_one()
            {
                /* pick a random type (outside the exception loop) to have a deterministic and exhaustive
                    exception test at least in isolation (in single-thread tests). */
                const auto type_index =
                  m_random.get_int<size_t>(m_parent_tester.m_put_cases.size() - 1);

                auto put_func = [&] {
                    if (m_random.get_bool())
                    {
                        bool put_done =
                          (*m_parent_tester.m_put_cases[type_index])(m_queue, m_random);
                        if (put_done)
                        {
                            // done! From now on no exception can occur
                            auto & counters = m_final_stats.m_counters[type_index];
                            counters.m_existing++;
                            counters.m_spawned++;

                            m_put_committed++;
                        }
                    }
                    else
                    {
                        auto transaction =
                          (*m_parent_tester.m_reentrant_put_cases[type_index])(m_queue, m_random);
                        if (transaction)
                        {
                            m_pending_reentrant_puts.push_back(
                              ReentrantPut(type_index, std::move(transaction)));
                        }
                    }
                };

                if (
                  (m_flags & QueueTesterFlags::eTestExceptions) ==
                  QueueTesterFlags::eTestExceptions)
                {
                    m_final_stats.m_exceptions_during_puts += run_exception_test(put_func);
                }
                else
                {
                    put_func();
                }
            }